

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

void X509_OBJECT_up_ref_count(X509_OBJECT *a)

{
  X509_OBJECT *a_local;
  
  if (a->type == 1) {
    X509_up_ref((X509 *)(a->data).x509);
  }
  else if (a->type == 2) {
    X509_CRL_up_ref((X509_CRL *)(a->data).x509);
  }
  return;
}

Assistant:

static int X509_OBJECT_up_ref_count(X509_OBJECT *a) {
  switch (a->type) {
    case X509_LU_X509:
      X509_up_ref(a->data.x509);
      break;
    case X509_LU_CRL:
      X509_CRL_up_ref(a->data.crl);
      break;
  }
  return 1;
}